

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

int __thiscall Catch::Session::runInternal(Session *this)

{
  const_iterator __position;
  element_type *peVar1;
  TestCaseInfo *pTVar2;
  TestCase **ppTVar3;
  pointer pTVar4;
  _func_int **pp_Var5;
  long lVar6;
  undefined8 uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar11;
  undefined4 extraout_var;
  long *plVar12;
  size_type *psVar13;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  _Base_ptr p_Var14;
  size_type sVar15;
  size_type sVar16;
  const_iterator __begin3_1;
  pointer pbVar17;
  _func_int **pp_Var18;
  pointer *__ptr;
  int iVar19;
  TestCase **__v;
  pointer pFVar20;
  undefined8 *puVar21;
  iterator __begin3;
  undefined1 auVar22 [8];
  pointer pTVar23;
  TestCaseInfo *testCaseInfo;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  Totals totals;
  string filename;
  _Head_base<0UL,_Catch::IStreamingReporter_*,_false> local_348;
  undefined8 *local_340;
  undefined1 local_338 [16];
  undefined1 local_328 [56];
  IStreamingReporterPtr local_2f0;
  undefined1 local_2e8 [24];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  pointer local_2b0;
  undefined1 local_2a8 [16];
  SourceLineInfo local_298;
  element_type *local_280;
  undefined1 local_278 [240];
  long *local_188;
  ulong local_168;
  long *local_140;
  undefined1 local_78 [48];
  undefined1 auStack_48 [8];
  undefined1 local_40 [16];
  
  if (this->m_startupExceptions != false) {
    return 1;
  }
  if ((this->m_configData).showHelp != false) {
    return 0;
  }
  if ((this->m_configData).libIdentify != false) {
    return 0;
  }
  config(this);
  seedRng(&((this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_IConfig);
  pbVar17 = (pointer)&this->m_config;
  if ((this->m_configData).filenamesAsTags == true) {
    peVar1 = (((shared_ptr<Catch::Config> *)pbVar17)->
             super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_2b0 = pbVar17;
    pSVar11 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
              ::getInternal();
    iVar9 = (*(pSVar11->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar11);
    plVar12 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar9) + 0x18))
                                ((long *)CONCAT44(extraout_var,iVar9),peVar1);
    testCaseInfo = (TestCaseInfo *)*plVar12;
    pTVar2 = (TestCaseInfo *)plVar12[1];
    pbVar17 = local_2b0;
    if (testCaseInfo != pTVar2) {
      do {
        clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_338,&testCaseInfo->tags);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_278,(testCaseInfo->lineInfo).file,(allocator<char> *)&local_348);
        sVar15 = local_278._8_8_;
        do {
          if (sVar15 == 0) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_278,0,0,"#",1);
            goto LAB_0012e98e;
          }
          sVar15 = sVar15 - 1;
        } while ((*(char *)(local_278._0_8_ + sVar15) != '/') &&
                (*(char *)(local_278._0_8_ + sVar15) != '\\'));
        clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        erase((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,0,
              sVar15);
        *(char *)local_278._0_8_ = '#';
LAB_0012e98e:
        sVar15 = local_278._8_8_;
        if (local_278._8_8_ != 0) {
          do {
            sVar16 = sVar15 - 1;
            if (sVar15 == 0) goto LAB_0012e9c2;
            lVar6 = sVar15 - 1;
            sVar15 = sVar16;
          } while (*(char *)(local_278._0_8_ + lVar6) != '.');
          *(char *)(local_278._0_8_ + sVar16) = '\0';
          local_278._8_8_ = sVar16;
        }
LAB_0012e9c2:
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_338,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278);
        clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_2e8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_338);
        setTags(testCaseInfo,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2e8);
        clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2e8);
        if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
          operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
        }
        clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_338);
        testCaseInfo = (TestCaseInfo *)&testCaseInfo[1].name.field_2;
        pbVar17 = local_2b0;
      } while (testCaseInfo != pTVar2);
    }
  }
  list((Catch *)local_278,(shared_ptr<Catch::Config> *)pbVar17);
  if ((int *)local_278._0_8_ != (int *)0x0) {
    if (0xfe < *(int *)local_278._0_8_) {
      return 0xff;
    }
    return *(int *)local_278._0_8_;
  }
  local_278._0_8_ =
       (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_278._8_8_ =
       (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  local_2e8._0_4_ = (undefined4)local_278._0_8_;
  local_2e8._4_4_ = (undefined4)((ulong)local_278._0_8_ >> 0x20);
  if ((pointer)local_278._8_8_ == (pointer)0x0) {
    local_2e8._8_8_ = (pointer)0x0;
    goto LAB_0012eab4;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    *(int *)&((pointer)local_278._8_8_)->_M_string_length =
         (int)((pointer)local_278._8_8_)->_M_string_length + 1;
    UNLOCK();
    peVar1 = (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_2e8._8_8_ =
         (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    local_2e8._0_4_ = SUB84(peVar1,0);
    local_2e8._4_4_ = (undefined4)((ulong)peVar1 >> 0x20);
    if ((pointer)local_2e8._8_8_ == (pointer)0x0) goto LAB_0012eab4;
    psVar13 = &((pointer)local_2e8._8_8_)->_M_string_length;
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)psVar13 = (int)*psVar13 + 1;
      UNLOCK();
      goto LAB_0012eab4;
    }
  }
  else {
    *(int *)&((pointer)local_278._8_8_)->_M_string_length =
         (int)((pointer)local_278._8_8_)->_M_string_length + 1;
    psVar13 = &((pointer)local_278._8_8_)->_M_string_length;
    local_2e8._8_8_ = local_278._8_8_;
  }
  *(int *)psVar13 = (int)*psVar13 + 1;
LAB_0012eab4:
  pSVar11 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
            ::getInternal();
  iVar9 = (*(pSVar11->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar11);
  plVar12 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar9) + 0x20))
                              ((long *)CONCAT44(extraout_var_00,iVar9));
  local_2b0 = pbVar17;
  if (*plVar12 == plVar12[1]) {
    local_338._0_8_ =
         (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_338._8_8_ =
         (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_)->_M_use_count + 1;
      }
    }
    anon_unknown_1::createReporter
              ((anon_unknown_1 *)&local_2f0,
               &(((element_type *)local_338._0_8_)->m_data).reporterName,(IConfigPtr *)local_338);
  }
  else {
    local_2f0._M_t.
    super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
    ._M_t.
    super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
    .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl =
         (__uniq_ptr_data<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>,_true,_true>
          )operator_new(0x30);
    *(undefined ***)
     local_2f0._M_t.
     super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
     ._M_t.
     super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
     .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl =
         &PTR__ListeningReporter_001ccf30;
    *(undefined1 (*) [16])
     ((long)local_2f0._M_t.
            super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
            ._M_t.
            super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
            .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl + 8) =
         (undefined1  [16])0x0;
    *(undefined1 (*) [16])
     ((long)local_2f0._M_t.
            super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
            ._M_t.
            super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
            .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl + 0x18) =
         (undefined1  [16])0x0;
    *(undefined2 *)
     &((IStreamingReporter *)
      ((long)local_2f0._M_t.
             super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
             ._M_t.
             super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
             .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl + 0x28))->
      _vptr_IStreamingReporter = 0x100;
    local_2a8._0_8_ =
         local_2f0._M_t.
         super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
         ._M_t.
         super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
         .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
    pSVar11 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
              ::getInternal();
    iVar9 = (*(pSVar11->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar11);
    plVar12 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar9) + 0x20))
                                ((long *)CONCAT44(extraout_var_01,iVar9));
    puVar21 = (undefined8 *)*plVar12;
    local_340 = (undefined8 *)plVar12[1];
    if (puVar21 != local_340) {
      local_328._48_8_ = local_2a8._0_8_ + 8;
      do {
        plVar12 = (long *)*puVar21;
        peVar1 = (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        pFVar20 = (pointer)(this->m_config).
                           super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                           ._M_pi;
        if (pFVar20 != (pointer)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            psVar13 = &(pFVar20->name)._M_string_length;
            *(int *)psVar13 = (int)*psVar13 + 1;
            UNLOCK();
          }
          else {
            psVar13 = &(pFVar20->name)._M_string_length;
            *(int *)psVar13 = (int)*psVar13 + 1;
          }
        }
        iVar9 = (*(peVar1->super_IConfig).super_NonCopyable._vptr_NonCopyable[3])(peVar1);
        local_338._0_8_ = CONCAT44(extraout_var_02,iVar9);
        if (pFVar20 != (pointer)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            psVar13 = &(pFVar20->name)._M_string_length;
            *(int *)psVar13 = (int)*psVar13 + 1;
            UNLOCK();
          }
          else {
            psVar13 = &(pFVar20->name)._M_string_length;
            *(int *)psVar13 = (int)*psVar13 + 1;
          }
        }
        local_338._8_8_ = peVar1;
        local_328._0_8_ = pFVar20;
        (**(code **)(*plVar12 + 0x10))(&local_348,plVar12,local_338);
        std::
        vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
        ::
        emplace_back<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>
                  ((vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
                    *)local_328._48_8_,
                   (unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                    *)&local_348);
        if (local_348._M_head_impl != (IStreamingReporter *)0x0) {
          (*(local_348._M_head_impl)->_vptr_IStreamingReporter[1])();
        }
        local_348._M_head_impl = (IStreamingReporter *)0x0;
        if ((pointer)local_328._0_8_ != (pointer)0x0) {
          clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_328._0_8_);
        }
        if (pFVar20 != (pointer)0x0) {
          clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pFVar20);
        }
        puVar21 = puVar21 + 2;
      } while (puVar21 != local_340);
    }
    local_338._0_8_ =
         (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_338._8_8_ =
         (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    uVar7 = local_2a8._0_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_)->_M_use_count + 1;
      }
    }
    anon_unknown_1::createReporter
              ((anon_unknown_1 *)&local_348,
               &(((element_type *)local_338._0_8_)->m_data).reporterName,(IConfigPtr *)local_338);
    ListeningReporter::addReporter((ListeningReporter *)uVar7,(IStreamingReporterPtr *)&local_348);
    if (local_348._M_head_impl != (IStreamingReporter *)0x0) {
      (*(local_348._M_head_impl)->_vptr_IStreamingReporter[1])();
    }
    local_348._M_head_impl = (IStreamingReporter *)0x0;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_);
  }
  RunContext::RunContext((RunContext *)(local_278 + 0x10),(IConfigPtr *)local_2e8,&local_2f0);
  if (local_2f0._M_t.
      super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
      ._M_t.
      super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
      .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>)
      0x0) {
    (*(*(_func_int ***)
        local_2f0._M_t.
        super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
        ._M_t.
        super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
        .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl)[1])();
  }
  if ((pointer)local_2e8._8_8_ != (pointer)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e8._8_8_);
  }
  uVar7 = local_278._0_8_;
  __position._M_node = (_Base_ptr)(local_78 + 8);
  local_78._8_4_ = 0;
  local_78._16_8_ = 0;
  stack0xffffffffffffffb0 = (undefined1  [16])0x0;
  local_40 = (undefined1  [16])0x0;
  local_78._24_8_ = __position._M_node;
  local_78._32_8_ = __position._M_node;
  pSVar11 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
            ::getInternal();
  iVar9 = (*(pSVar11->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar11);
  testCases = (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
              (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar9) + 0x18))
                        ((long *)CONCAT44(extraout_var_03,iVar9),uVar7);
  iVar9 = (**(code **)(*(long *)local_278._0_8_ + 0x68))();
  TestSpec::matchesByFilter
            ((Matches *)local_2e8,(TestSpec *)CONCAT44(extraout_var_04,iVar9),testCases,
             (IConfig *)local_278._0_8_);
  local_328._0_8_ = local_40._8_8_;
  sVar15 = CONCAT44(local_2e8._4_4_,local_2e8._0_4_);
  local_338._8_8_ = local_40._0_8_;
  local_40._8_8_ = local_2e8._16_8_;
  local_40._0_8_ = local_2e8._8_8_;
  local_338._0_8_ = auStack_48;
  local_2e8._0_4_ = 0;
  local_2e8._4_4_ = 0;
  local_2e8._8_8_ = (pointer)0x0;
  local_2e8._16_8_ = (pointer)0x0;
  auStack_48 = (undefined1  [8])sVar15;
  clara::std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
  ~vector((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> *)
          local_338);
  clara::std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
  ~vector((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> *)
          local_2e8);
  iVar9 = (**(code **)(*(long *)local_278._0_8_ + 0x68))();
  local_340 = (undefined8 *)local_40._0_8_;
  if (auStack_48 == (undefined1  [8])local_40._0_8_) {
    if (*(long *)(CONCAT44(extraout_var_05,iVar9) + 0x18) ==
        *(long *)(CONCAT44(extraout_var_05,iVar9) + 0x20)) {
      pTVar23 = (testCases->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pTVar4 = (testCases->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if (pTVar23 != pTVar4) {
        do {
          if (((pTVar23->super_TestCaseInfo).properties & IsHidden) == None) {
            local_338._0_8_ = pTVar23;
            std::
            _Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
            ::_M_emplace_unique<Catch::TestCase_const*>
                      ((_Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
                        *)local_78,(TestCase **)local_338);
          }
          pTVar23 = pTVar23 + 1;
        } while (pTVar23 != pTVar4);
      }
    }
  }
  else {
    auVar22 = auStack_48;
    do {
      ppTVar3 = *(TestCase ***)((long)auVar22 + 0x28);
      local_338._0_8_ = (pointer)local_78;
      for (__v = *(TestCase ***)((long)auVar22 + 0x20); __v != ppTVar3; __v = __v + 1) {
        std::
        _Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
        ::
        _M_insert_unique_<Catch::TestCase_const*const&,std::_Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>::_Alloc_node>
                  ((_Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
                    *)local_78,__position,__v,(_Alloc_node *)local_338);
      }
      auVar22 = (undefined1  [8])((long)auVar22 + 0x38);
    } while (auVar22 != (undefined1  [8])local_340);
  }
  iVar9 = (**(code **)(*(long *)local_278._0_8_ + 0x68))();
  local_2e8._0_4_ = 0;
  local_2e8._8_8_ = (pointer)0x0;
  local_2e8._16_8_ = (pointer)0x0;
  local_2d0 = (undefined1  [16])0x0;
  local_2c0 = (undefined1  [16])0x0;
  (**(code **)(*(long *)local_278._0_8_ + 0x20))(local_338);
  RunContext::testGroupStarting((RunContext *)(local_278 + 0x10),(string *)local_338,1,1);
  if ((pointer)local_338._0_8_ != (pointer)local_328) {
    operator_delete((void *)local_338._0_8_,(ulong)(local_328._0_8_ + 1));
  }
  pFVar20 = (pointer)0x0;
  local_280 = (element_type *)CONCAT44(extraout_var_06,iVar9);
  if ((_Base_ptr)local_78._24_8_ != __position._M_node) {
    local_2a8 = (undefined1  [16])0x0;
    local_328._48_8_ =
         (vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
          *)0x0;
    local_340 = (undefined8 *)0x0;
    pFVar20 = (pointer)0x0;
    pbVar17 = (pointer)0x0;
    local_298.file = (char *)0x0;
    local_298.line = 0;
    p_Var14 = (_Base_ptr)local_78._24_8_;
    do {
      uVar8 = local_168;
      iVar9 = (**(code **)(*local_188 + 0x48))();
      if (uVar8 < (ulong)(long)iVar9) {
        RunContext::runTest((Totals *)local_338,(RunContext *)(local_278 + 0x10),
                            *(TestCase **)(p_Var14 + 1));
        pbVar17 = (pointer)((long)&(pbVar17->_M_dataplus)._M_p + local_338._8_8_);
        pFVar20 = (pointer)((long)&(pFVar20->name)._M_dataplus._M_p + local_328._0_8_);
        local_340 = (undefined8 *)((long)local_340 + local_328._8_8_);
        local_298.file = (char *)((long)&((_Alloc_hider *)local_2a8._0_8_)->_M_p + local_328._16_8_)
        ;
        local_298.line = (long)&((_Alloc_hider *)local_2a8._8_8_)->_M_p + local_328._24_8_;
        local_328._48_8_ = local_328._32_8_ + local_328._48_8_;
        local_2a8._8_8_ = local_298.line;
        local_2a8._0_8_ = local_298.file;
      }
      else {
        (**(code **)(*local_140 + 0x78))(local_140,*(undefined8 *)(p_Var14 + 1));
      }
      p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
    } while (p_Var14 != __position._M_node);
    local_2d0._8_8_ = local_298.file;
    local_2d0._0_8_ = local_340;
    local_2c0._8_8_ = local_328._48_8_;
    local_2c0._0_8_ = local_298.line;
    local_2e8._8_8_ = pbVar17;
    local_2e8._16_8_ = pFVar20;
  }
  iVar19 = 0;
  uVar7 = local_40._0_8_;
  iVar9 = local_2e8._0_4_;
  if (auStack_48 != (undefined1  [8])local_40._0_8_) {
    iVar19 = 0;
    auVar22 = auStack_48;
    do {
      if (*(long *)((long)auVar22 + 0x20) == *(long *)((long)auVar22 + 0x28)) {
        iVar19 = -1;
        (**(code **)(*local_140 + 0x18))(local_140,auVar22);
      }
      auVar22 = (undefined1  [8])((long)auVar22 + 0x38);
      iVar9 = iVar19;
    } while (auVar22 != (undefined1  [8])uVar7);
  }
  local_2e8._0_4_ = iVar9;
  pp_Var5 = local_280[4]._vptr_ITestInvoker;
  for (pp_Var18 = local_280[3]._vptr_ITestInvoker; pp_Var18 != pp_Var5; pp_Var18 = pp_Var18 + 4) {
    (**(code **)(*local_140 + 0x20))(local_140,pp_Var18);
  }
  (**(code **)(*(long *)local_278._0_8_ + 0x20))(local_338);
  RunContext::testGroupEnded
            ((RunContext *)(local_278 + 0x10),(string *)local_338,(Totals *)local_2e8,1,1);
  pbVar17 = local_2b0;
  if ((pointer)local_338._0_8_ != (pointer)local_328) {
    operator_delete((void *)local_338._0_8_,(ulong)(local_328._0_8_ + 1));
  }
  iVar10 = (*(((__shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2> *)&pbVar17->_M_dataplus)->
              _M_ptr->super_IConfig).super_NonCopyable._vptr_NonCopyable[8])();
  iVar9 = 2;
  if (((byte)iVar10 & iVar19 == -1) == 0) {
    iVar9 = (int)pFVar20;
    if ((int)pFVar20 < iVar19) {
      iVar9 = iVar19;
    }
    if (0xfe < iVar9) {
      iVar9 = 0xff;
    }
  }
  clara::std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
  ~vector((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> *)
          auStack_48);
  clara::std::
  _Rb_tree<const_Catch::TestCase_*,_const_Catch::TestCase_*,_std::_Identity<const_Catch::TestCase_*>,_std::less<const_Catch::TestCase_*>,_std::allocator<const_Catch::TestCase_*>_>
  ::~_Rb_tree((_Rb_tree<const_Catch::TestCase_*,_const_Catch::TestCase_*,_std::_Identity<const_Catch::TestCase_*>,_std::less<const_Catch::TestCase_*>,_std::allocator<const_Catch::TestCase_*>_>
               *)local_78);
  RunContext::~RunContext((RunContext *)(local_278 + 0x10));
  if ((pointer)local_278._8_8_ != (pointer)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
  }
  return iVar9;
}

Assistant:

int Session::runInternal() {
        if( m_startupExceptions )
            return 1;

        if (m_configData.showHelp || m_configData.libIdentify) {
            return 0;
        }

        CATCH_TRY {
            config(); // Force config to be constructed

            seedRng( *m_config );

            if( m_configData.filenamesAsTags )
                applyFilenamesAsTags( *m_config );

            // Handle list request
            if( Option<std::size_t> listed = list( m_config ) )
                return (std::min) (MaxExitCode, static_cast<int>(*listed));

            TestGroup tests { m_config };
            auto const totals = tests.execute();

            if( m_config->warnAboutNoTests() && totals.error == -1 )
                return 2;

            // Note that on unices only the lower 8 bits are usually used, clamping
            // the return value to 255 prevents false negative when some multiple
            // of 256 tests has failed
            return (std::min) (MaxExitCode, (std::max) (totals.error, static_cast<int>(totals.assertions.failed)));
        }